

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O2

finish_with __thiscall cppwinrt::wrap_lean_and_mean(cppwinrt *this,writer *w,bool is_lean_and_mean)

{
  code *pcVar1;
  undefined7 in_register_00000011;
  _func_void_writer_ptr *p_Var2;
  _func_void_writer_ptr *extraout_RDX;
  finish_with fVar3;
  string_view local_20;
  
  p_Var2 = (_func_void_writer_ptr *)CONCAT71(in_register_00000011,is_lean_and_mean);
  if ((int)p_Var2 == 0) {
    pcVar1 = write_nothing;
  }
  else {
    local_20._M_len = 0x1c;
    local_20._M_str = "#ifndef WINRT_LEAN_AND_MEAN\n";
    writer_base<cppwinrt::writer>::write_impl(&w->super_writer_base<cppwinrt::writer>,&local_20);
    pcVar1 = write_endif;
    p_Var2 = extraout_RDX;
  }
  *(writer **)this = w;
  *(code **)(this + 8) = pcVar1;
  fVar3.finisher = p_Var2;
  fVar3.w = (writer *)this;
  return fVar3;
}

Assistant:

[[nodiscard]] static finish_with wrap_lean_and_mean(writer& w, bool is_lean_and_mean = true)
    {
        if (is_lean_and_mean)
        {
            auto format = R"(#ifndef WINRT_LEAN_AND_MEAN
)";

            w.write(format);

            return { w, write_endif };
        }
        else
        {
            return { w, write_nothing };
        }
    }